

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__iou_fs_statx_post(uv_fs_t *req)

{
  uv__statx *statxbuf_00;
  uv_stat_t *buf;
  uv__statx *statxbuf;
  uv_fs_t *req_local;
  
  statxbuf_00 = (uv__statx *)req->ptr;
  req->ptr = (void *)0x0;
  if (req->result == 0) {
    uv__statx_to_stat(statxbuf_00,&req->statbuf);
    req->ptr = &req->statbuf;
  }
  uv__free(statxbuf_00);
  return;
}

Assistant:

static void uv__iou_fs_statx_post(uv_fs_t* req) {
  struct uv__statx* statxbuf;
  uv_stat_t* buf;

  buf = &req->statbuf;
  statxbuf = req->ptr;
  req->ptr = NULL;

  if (req->result == 0) {
    uv__msan_unpoison(statxbuf, sizeof(*statxbuf));
    uv__statx_to_stat(statxbuf, buf);
    req->ptr = buf;
  }

  uv__free(statxbuf);
}